

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::UntypedMapBase::TableEntryIsTooLong(UntypedMapBase *this,map_index_t b)

{
  undefined1 auVar1 [16];
  map_index_t b_00;
  ulong *puVar2;
  NodeBase *pNVar3;
  iterator *it;
  undefined1 *puVar4;
  UntypedMapBase *this_00;
  NodeAndBucket NVar5;
  
  puVar2 = (ulong *)this->table_[b];
  if (((ulong)puVar2 & 1) == 0) {
    this_00 = (UntypedMapBase *)0x0;
    do {
      this_00 = (UntypedMapBase *)((long)&this_00->num_elements_ + 1);
      puVar2 = (ulong *)*puVar2;
    } while (puVar2 != (ulong *)0x0);
    if (this_00 < (UntypedMapBase *)0x9) {
      return this_00 == (UntypedMapBase *)0x8;
    }
  }
  else {
    this_00 = (UntypedMapBase *)&stack0xfffffffffffffff0;
    TableEntryIsTooLong(this_00);
  }
  puVar4 = &stack0xfffffffffffffff0;
  TableEntryIsTooLong();
  b_00 = KeyMapBase<unsigned_int>::BucketNumber
                   ((KeyMapBase<unsigned_int> *)this_00,(ViewType)puVar4);
  pNVar3 = (NodeBase *)this_00->table_[b_00];
  if (((ulong)pNVar3 & 1) == 0 && pNVar3 != (NodeBase *)0x0) {
    do {
      if (*(ViewType *)&pNVar3[1].next == (ViewType)puVar4) goto LAB_0015d7b1;
      pNVar3 = pNVar3->next;
    } while (pNVar3 != (NodeBase *)0x0);
  }
  else if (((ulong)pNVar3 & 1) != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)puVar4 & 0xffffffff;
    NVar5 = FindFromTree(this_00,b_00,(VariantKey)(auVar1 << 0x40),it);
    pNVar3 = NVar5.node;
    goto LAB_0015d7b1;
  }
  pNVar3 = (NodeBase *)0x0;
LAB_0015d7b1:
  return SUB81(pNVar3,0);
}

Assistant:

bool TableEntryIsTooLong(map_index_t b) {
    return internal::TableEntryIsTooLong(TableEntryToNode(table_[b]));
  }